

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int protocol_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *pcVar1;
  curl_socket_t cVar2;
  curl_socket_t sockfd;
  connectdata *conn;
  curl_socket_t *socks_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    data_local._4_4_ = 0;
  }
  else if (pcVar1->handler->proto_getsock ==
           (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0) {
    cVar2 = Curl_conn_get_socket(data,0);
    if (cVar2 == -1) {
      data_local._4_4_ = 0;
    }
    else {
      *socks = cVar2;
      data_local._4_4_ = 1;
    }
  }
  else {
    data_local._4_4_ = (*pcVar1->handler->proto_getsock)(data,pcVar1,socks);
  }
  return data_local._4_4_;
}

Assistant:

static int protocol_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd;

  if(!conn)
    return GETSOCK_BLANK;
  if(conn->handler->proto_getsock)
    return conn->handler->proto_getsock(data, conn, socks);
  sockfd = Curl_conn_get_socket(data, FIRSTSOCKET);
  if(sockfd != CURL_SOCKET_BAD) {
    /* Default is to wait to something from the server */
    socks[0] = sockfd;
    return GETSOCK_READSOCK(0);
  }
  return GETSOCK_BLANK;
}